

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O3

int __thiscall
glcts::ShaderTextureImageSampleFunctionalTest::init
          (ShaderTextureImageSampleFunctionalTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  deUint32 err;
  int extraout_EAX;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  GLint max_image_samples;
  int local_44;
  string local_40;
  
  iVar1 = ShaderTextureImageSamplesTestBase::init
                    (&this->super_ShaderTextureImageSamplesTestBase,ctx);
  if (*(int *)&(this->super_ShaderTextureImageSamplesTestBase).field_0xa4 == 0) {
    iVar1 = (*((this->super_ShaderTextureImageSamplesTestBase).super_TestCase.m_context)->
              m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x906d,&local_44);
    err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(err,"glGetIntegerv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                    ,0x264);
    iVar1 = extraout_EAX;
    if (local_44 == 0) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"GL_MAX_IMAGE_SAMPLES == 0","");
      tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return iVar1;
}

Assistant:

void ShaderTextureImageSampleFunctionalTest::init()
{
	ShaderTextureImageSamplesTestBase::init();

	if (type_to_test == TEST_TYPE_IMAGE)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		glw::GLint max_image_samples;
		gl.getIntegerv(GL_MAX_IMAGE_SAMPLES, &max_image_samples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");

		if (max_image_samples == 0)
		{
			throw tcu::NotSupportedError("GL_MAX_IMAGE_SAMPLES == 0");
		}
	}
}